

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

UBool __thiscall
icu_63::UVector::ensureCapacity(UVector *this,int32_t minimumCapacity,UErrorCode *status)

{
  int iVar1;
  UElement *pUVar2;
  uint uVar3;
  
  if (-1 < minimumCapacity) {
    iVar1 = this->capacity;
    if (minimumCapacity <= iVar1) {
      return '\x01';
    }
    if (iVar1 < 0x40000000) {
      uVar3 = iVar1 * 2;
      if (iVar1 * 2 <= minimumCapacity) {
        uVar3 = minimumCapacity;
      }
      if (uVar3 < 0x10000000) {
        pUVar2 = (UElement *)uprv_realloc_63(this->elements,(ulong)(uVar3 * 8));
        if (pUVar2 == (UElement *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
          return '\0';
        }
        this->elements = pUVar2;
        this->capacity = uVar3;
        return '\x01';
      }
    }
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return '\0';
}

Assistant:

UBool UVector::ensureCapacity(int32_t minimumCapacity, UErrorCode &status) {
	if (minimumCapacity < 0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
	}
    if (capacity < minimumCapacity) {
        if (capacity > (INT32_MAX - 1) / 2) {        	// integer overflow check
        	status = U_ILLEGAL_ARGUMENT_ERROR;
        	return FALSE;
        }
        int32_t newCap = capacity * 2;
        if (newCap < minimumCapacity) {
            newCap = minimumCapacity;
        }
        if (newCap > (int32_t)(INT32_MAX / sizeof(UElement))) {	// integer overflow check
        	// We keep the original memory contents on bad minimumCapacity.
        	status = U_ILLEGAL_ARGUMENT_ERROR;
        	return FALSE;
        }
        UElement* newElems = (UElement *)uprv_realloc(elements, sizeof(UElement)*newCap);
        if (newElems == NULL) {
            // We keep the original contents on the memory failure on realloc or bad minimumCapacity.
            status = U_MEMORY_ALLOCATION_ERROR;
            return FALSE;
        }
        elements = newElems;
        capacity = newCap;
    }
    return TRUE;
}